

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# element.c
# Opt level: O0

int ixmlElement_setTagName(IXML_Element *element,char *tagName)

{
  char *pcVar1;
  int local_24;
  int rc;
  char *tagName_local;
  IXML_Element *element_local;
  
  local_24 = 0;
  if ((element != (IXML_Element *)0x0) && (tagName != (char *)0x0)) {
    if ((element == (IXML_Element *)0x0) || (tagName == (char *)0x0)) {
      element_local._4_4_ = 0x6a;
    }
    else {
      if (element->tagName != (char *)0x0) {
        free(element->tagName);
      }
      pcVar1 = strdup(tagName);
      element->tagName = pcVar1;
      if (element->tagName == (char *)0x0) {
        local_24 = 0x66;
      }
      element_local._4_4_ = local_24;
    }
    return element_local._4_4_;
  }
  __assert_fail("element != NULL && tagName != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/pupnp[P]pupnp/ixml/src/element.c"
                ,0x41,"int ixmlElement_setTagName(IXML_Element *, const char *)");
}

Assistant:

int ixmlElement_setTagName(IXML_Element *element, const char *tagName)
{
	int rc = IXML_SUCCESS;

	assert(element != NULL && tagName != NULL);

	if (element == NULL || tagName == NULL) {
		return IXML_FAILED;
	}

	if (element->tagName != NULL) {
		free(element->tagName);
	}
	element->tagName = strdup(tagName);
	if (element->tagName == NULL) {
		rc = IXML_INSUFFICIENT_MEMORY;
	}

	return rc;
}